

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

int Parser::init(EVP_PKEY_CTX *ctx)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  size_type sVar6;
  mapped_type *__k;
  mapped_type *__args;
  ostream *poVar7;
  bool bVar8;
  long lVar9;
  int i;
  ulong uVar10;
  bool local_2dd;
  int local_2dc;
  Rule nowRule;
  string local_2b8;
  string nowString;
  string local_278;
  string local_258;
  ifstream in;
  
  getEnds();
  std::ifstream::ifstream((string *)&in);
  std::ifstream::open((string *)&in,(_Ios_Openmode)ctx);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar7 = std::operator<<((ostream *)&std::cerr,"open ");
    poVar7 = std::operator<<(poVar7,(string *)ctx);
    poVar7 = std::operator<<(poVar7," wrong");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    nowString._M_dataplus._M_p = (pointer)&nowString.field_2;
    nowString._M_string_length = 0;
    nowString.field_2._M_local_buf[0] = '\0';
    nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar4 = 0;
    bVar3 = true;
LAB_001079c8:
    bVar8 = bVar3;
    piVar5 = std::operator>>((istream *)&in,(string *)&nowString);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      bVar2 = std::operator==(&nowString,"#");
      bVar3 = true;
      if (!bVar2) {
        bVar2 = std::operator==(&nowString,"->");
        bVar3 = false;
        if (!bVar2) {
          if (bVar8) {
            std::__cxx11::string::string((string *)&local_278,(string *)&nowString);
            iVar4 = addMid(&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            bVar3 = true;
            goto LAB_001079c8;
          }
          bVar3 = std::operator!=(&nowString,"$");
          if (bVar3) {
            sVar6 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)endTran_abi_cxx11_,&nowString);
            if (sVar6 == 0) {
              bVar3 = std::operator==(&nowString,"none");
              if (bVar3) {
                *(undefined1 *)(mids + 0x20 + (long)iVar4 * 0xd0) = 1;
              }
              else {
                std::__cxx11::string::string((string *)&local_258,(string *)&nowString);
                local_2dc = addMid(&local_258);
                local_2dd = false;
                std::vector<Parser::Node,std::allocator<Parser::Node>>::emplace_back<int,bool>
                          ((vector<Parser::Node,std::allocator<Parser::Node>> *)&nowRule,&local_2dc,
                           &local_2dd);
                std::__cxx11::string::~string((string *)&local_258);
              }
            }
            else {
              __k = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)endTran_abi_cxx11_,&nowString);
              __args = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)endToId_abi_cxx11_,__k);
              local_2dc = CONCAT31(local_2dc._1_3_,1);
              std::vector<Parser::Node,std::allocator<Parser::Node>>::emplace_back<int&,bool>
                        ((vector<Parser::Node,std::allocator<Parser::Node>> *)&nowRule,__args,
                         (bool *)&local_2dc);
            }
          }
          else {
            bVar3 = std::operator==(&nowString,"$");
            if (!bVar3) {
              std::__cxx11::string::string
                        ((string *)&local_2b8,"Parse Error",(allocator *)&local_2dc);
              ERROR(&local_2b8);
              std::__cxx11::string::~string((string *)&local_2b8);
              poVar7 = std::operator<<((ostream *)&std::cerr,"Parse Error");
              std::endl<char,std::char_traits<char>>(poVar7);
              goto LAB_00107c41;
            }
            std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::push_back
                      ((vector<Parser::Rule,_std::allocator<Parser::Rule>_> *)
                       (mids + (long)iVar4 * 0xd0 + 0x28),&nowRule);
            bVar3 = false;
            if (nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                _M_impl.super__Vector_impl_data._M_start) goto LAB_001079c8;
            nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          bVar3 = false;
        }
      }
      goto LAB_001079c8;
    }
    eliPassRecur();
    eliCommonPreffix();
    eliNone();
    getFirstSet();
    getEndSet();
    getSelectSet();
    lVar9 = 0;
    for (uVar10 = 0; uVar10 < (ulong)((DAT_001214f0 - mids) / 0xd0); uVar10 = uVar10 + 1) {
      print((Mid *)(mids + lVar9));
      lVar9 = lVar9 + 0xd0;
    }
LAB_00107c41:
    std::_Vector_base<Parser::Node,_std::allocator<Parser::Node>_>::~_Vector_base
              ((_Vector_base<Parser::Node,_std::allocator<Parser::Node>_> *)&nowRule);
    std::__cxx11::string::~string((string *)&nowString);
  }
  iVar4 = std::ifstream::~ifstream(&in);
  return iVar4;
}

Assistant:

void init(const string &fileName){
        getEnds();
        ifstream in;
        in.open(fileName);
        if(!in.is_open()){
            cerr<<"open "<<fileName<<" wrong"<<endl;
            return;
        }
        string nowString;
        Rule nowRule;
        int stat=0,nowMid=0;
        while(in>>nowString){
            if(nowString=="#"){
                stat = 0;
            }else if(nowString=="->"){
                stat = 1;
            }else if(stat==0){
                nowMid = addMid(nowString);
            }else if(nowString != "$"){
                if(endTran.count(nowString)){
                    nowRule.rights.emplace_back(endToId[endTran[nowString]],true);
                }else if(nowString == "none"){
                    mids[nowMid].canNone = true;
                }else{
                    nowRule.rights.emplace_back(addMid(nowString),false);
                }
            }else if(nowString == "$"){
                mids[nowMid].rules.push_back(nowRule);
                nowRule.rights.clear();
            }else{
                ERROR("Parse Error");
                cerr<<"Parse Error"<<endl;
                return;
            }
        }
        eliPassRecur();
        eliCommonPreffix();
        eliNone();
        getFirstSet();
        getEndSet();
        getSelectSet();
        // for(int i = 0;i < mids.size();i++){
        //     cout<<mids[i].sgn<<" -> ";
        //     for(auto t:mids[i].follow){
        //         cout<<ends[t]<<" ";
        //     }
        //     cout<<endl;
        // }
        for(int i = 0;i < mids.size();i++){
            print(mids[i]);
        }
    }